

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasta_diff.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer pcVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  uint uVar5;
  int iVar6;
  mapped_type *pmVar7;
  iterator iVar8;
  _Node *p_Var9;
  _Base_ptr p_Var10;
  ostream *poVar11;
  string *psVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  long lVar13;
  _List_node_base *p_Var14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar18;
  char automatonState;
  allocator local_129;
  key_type local_128;
  string err;
  _Alloc_hider local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  match_mode local_c4;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  updated_sequences;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  sequences_to_add;
  args_t args;
  long firstSequenceLength;
  size_t local_38;
  
  argparse::args_t::args_t(&args,argc,argv);
  firstSequenceLength = 1;
  automatonState = '\0';
  sequences_to_add._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sequences_to_add._M_t._M_impl.super__Rb_tree_header._M_header;
  sequences_to_add._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sequences_to_add._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sequences_to_add._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sequences_to_add._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sequences_to_add._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  initAlphabets(false,(char *)0x0,true);
  local_c4 = args.checks;
  if ((args.checks == sequence) && (args.op != remove)) {
    psVar12 = (string *)__cxa_allocate_exception(0x20);
    *(string **)psVar12 = psVar12 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              (psVar12,"sequence matching mode MUST also use the remove operation","");
    __cxa_throw(psVar12,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  do {
    uVar5 = readFASTA(args.input_add,&automatonState,&names,&sequences,&nameLengths,&seqLengths,
                      &firstSequenceLength,true,(Vector *)0x0,':',1.0,false);
    sVar4 = sequences_to_add._M_t._M_impl.super__Rb_tree_header._M_node_count;
    pcVar2 = names.sData;
    if (uVar5 == 0) {
      bVar15 = false;
    }
    else {
      bVar15 = uVar5 != 3;
      if ((uVar5 & 0xfffffffe) != 2) {
        psVar12 = (string *)__cxa_allocate_exception(0x20);
        *(string **)psVar12 = psVar12 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>(psVar12,"Error reading FASTA file","");
        __cxa_throw(psVar12,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      if (local_c4 == sequence) {
        std::__cxx11::string::string((string *)&err,sequences.sData,(allocator *)&local_128);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&sequences_to_add,&err);
        pcVar3 = (char *)pmVar7->_M_string_length;
        strlen(pcVar2);
        std::__cxx11::string::_M_replace((ulong)pmVar7,0,pcVar3,(ulong)pcVar2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)err._M_dataplus._M_p != &err.field_2) goto LAB_00105a59;
      }
      else {
        std::__cxx11::string::string
                  ((string *)&local_128,names.sData,(allocator *)&updated_sequences);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&sequences_to_add,&local_128);
        err._M_dataplus._M_p = (pointer)&err.field_2;
        pcVar1 = (pmVar7->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&err,pcVar1,pcVar1 + pmVar7->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_128._M_dataplus._M_p._1_7_,local_128._M_dataplus._M_p._0_1_) !=
            &local_128.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_128._M_dataplus._M_p._1_7_,local_128._M_dataplus._M_p._0_1_
                                  ),local_128.field_2._M_allocated_capacity + 1);
        }
        pcVar3 = sequences.sData;
        std::__cxx11::string::string
                  ((string *)&local_128,names.sData,(allocator *)&updated_sequences);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&sequences_to_add,&local_128);
        pcVar2 = (char *)pmVar7->_M_string_length;
        strlen(pcVar3);
        std::__cxx11::string::_M_replace((ulong)pmVar7,0,pcVar2,(ulong)pcVar3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_128._M_dataplus._M_p._1_7_,local_128._M_dataplus._M_p._0_1_) !=
            &local_128.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_128._M_dataplus._M_p._1_7_,local_128._M_dataplus._M_p._0_1_
                                  ),local_128.field_2._M_allocated_capacity + 1);
        }
        if (sVar4 == sequences_to_add._M_t._M_impl.super__Rb_tree_header._M_node_count) {
          std::__cxx11::string::string
                    ((string *)&local_128,names.sData,(allocator *)&updated_sequences);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&sequences_to_add,&local_128);
          if (err._M_string_length == pmVar7->_M_string_length) {
            if (err._M_string_length == 0) {
              bVar16 = true;
            }
            else {
              iVar6 = bcmp(err._M_dataplus._M_p,(pmVar7->_M_dataplus)._M_p,err._M_string_length);
              bVar16 = iVar6 == 0;
            }
          }
          else {
            bVar16 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_128._M_dataplus._M_p._1_7_,local_128._M_dataplus._M_p._0_1_) !=
              &local_128.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_128._M_dataplus._M_p._1_7_,
                                     local_128._M_dataplus._M_p._0_1_),
                            local_128.field_2._M_allocated_capacity + 1);
          }
          if (!bVar16) {
            __return_storage_ptr__ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x20);
            std::__cxx11::string::string
                      ((string *)&local_128,names.sData,(allocator *)&updated_sequences);
            std::operator+(__return_storage_ptr__,&local_128,
                           " is not a unique sequence ID in the master file and different instances of this name have different sequences"
                          );
            __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                        std::__cxx11::string::~string);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)err._M_dataplus._M_p != &err.field_2) {
LAB_00105a59:
          operator_delete(err._M_dataplus._M_p,err.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if (!bVar15) {
      local_38 = sequences_to_add._M_t._M_impl.super__Rb_tree_header._M_node_count;
      updated_sequences.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&updated_sequences;
      updated_sequences.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size = 0;
      updated_sequences.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev =
           updated_sequences.
           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
      do {
        uVar5 = readFASTA(args.input_master,&automatonState,&names,&sequences,&nameLengths,
                          &seqLengths,&firstSequenceLength,true,(Vector *)0x0,':',1.0,false);
        if (uVar5 == 0) {
          bVar15 = true;
        }
        else {
          bVar15 = uVar5 == 3;
          if ((uVar5 & 0xfffffffe) != 2) {
            psVar12 = (string *)__cxa_allocate_exception(0x20);
            *(string **)psVar12 = psVar12 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>(psVar12,"Error reading FASTA file","");
            __cxa_throw(psVar12,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          std::__cxx11::string::string((string *)&err,names.sData,(allocator *)&local_128);
          if (local_c4 == sequence) {
            std::__cxx11::string::string((string *)&local_128,sequences.sData,&local_129);
            iVar8 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::find(&sequences_to_add._M_t,&local_128);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_128._M_dataplus._M_p._1_7_,local_128._M_dataplus._M_p._0_1_) !=
                &local_128.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_128._M_dataplus._M_p._1_7_,
                                       local_128._M_dataplus._M_p._0_1_),
                              local_128.field_2._M_allocated_capacity + 1);
            }
            bVar16 = (_Rb_tree_header *)iVar8._M_node ==
                     &sequences_to_add._M_t._M_impl.super__Rb_tree_header;
            bVar17 = true;
          }
          else {
            iVar8 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::find(&sequences_to_add._M_t,&err);
            bVar17 = (_Rb_tree_header *)iVar8._M_node ==
                     &sequences_to_add._M_t._M_impl.super__Rb_tree_header;
            if (bVar17) {
              bVar16 = true;
            }
            else if (args.checks == id_and_sequence) {
              std::__cxx11::string::string((string *)&local_128,sequences.sData,&local_129);
              p_Var10 = iVar8._M_node[2]._M_parent;
              bVar16 = true;
              if (p_Var10 == (_Base_ptr)local_128._M_string_length) {
                if (p_Var10 == (_Base_ptr)0x0) {
                  bVar16 = false;
                }
                else {
                  iVar6 = bcmp(*(void **)(iVar8._M_node + 2),
                               (void *)CONCAT71(local_128._M_dataplus._M_p._1_7_,
                                                local_128._M_dataplus._M_p._0_1_),(size_t)p_Var10);
                  bVar16 = iVar6 != 0;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_128._M_dataplus._M_p._1_7_,local_128._M_dataplus._M_p._0_1_) !=
                  &local_128.field_2) {
                operator_delete((undefined1 *)
                                CONCAT71(local_128._M_dataplus._M_p._1_7_,
                                         local_128._M_dataplus._M_p._0_1_),
                                local_128.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              bVar16 = false;
            }
          }
          if (bVar16) {
            if ((bool)(args.op != replace | bVar17)) {
              if (!bVar17) {
                p_Var9 = std::__cxx11::
                         list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                         _M_create_node<std::__cxx11::string_const&>
                                   ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                     *)&updated_sequences,&err);
                std::__detail::_List_node_base::_M_hook(&p_Var9->super__List_node_base);
                updated_sequences.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node._M_size =
                     updated_sequences.
                     super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl._M_node._M_size + 1;
                if (args.op == add) {
                  pVar18 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::equal_range(&sequences_to_add._M_t,&err);
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::_M_erase_aux(&sequences_to_add._M_t,(_Base_ptr)pVar18.first._M_node,
                                 (_Base_ptr)pVar18.second._M_node);
                }
              }
              fprintf((FILE *)args.output,">%s\n%s\n",err._M_dataplus._M_p,sequences.sData);
            }
          }
          else if (args.op != replace) {
            if (args.op == add) {
              fprintf((FILE *)args.output,">%s\n%s\n",err._M_dataplus._M_p,sequences.sData);
            }
            pVar18 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::equal_range(&sequences_to_add._M_t,&err);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::_M_erase_aux(&sequences_to_add._M_t,(_Base_ptr)pVar18.first._M_node,
                           (_Base_ptr)pVar18.second._M_node);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)err._M_dataplus._M_p != &err.field_2) {
            operator_delete(err._M_dataplus._M_p,err.field_2._M_allocated_capacity + 1);
          }
        }
      } while (!bVar15);
      if ((args.op != remove) &&
         ((_Rb_tree_header *)sequences_to_add._M_t._M_impl.super__Rb_tree_header._M_header._M_left
          != &sequences_to_add._M_t._M_impl.super__Rb_tree_header)) {
        p_Var10 = sequences_to_add._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&err,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)(p_Var10 + 1));
          fprintf((FILE *)args.output,">%s\n%s\n",err._M_dataplus._M_p,local_e8._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_p != &local_d8) {
            operator_delete(local_e8._M_p,local_d8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)err._M_dataplus._M_p != &err.field_2) {
            operator_delete(err._M_dataplus._M_p,err.field_2._M_allocated_capacity + 1);
          }
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
        } while ((_Rb_tree_header *)p_Var10 != &sequences_to_add._M_t._M_impl.super__Rb_tree_header)
        ;
      }
      funlockfile((FILE *)args.output);
      if (args.quiet == false) {
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
        std::ostream::put('@');
        poVar11 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"{",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        poVar11 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\'master\' :",10);
        poVar11 = std::ostream::_M_insert<long>((long)poVar11);
        local_128._M_dataplus._M_p._0_1_ = 0x2c;
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_128,1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        poVar11 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\'fasta\'  : ",0xb);
        poVar11 = std::ostream::_M_insert<long>((long)poVar11);
        local_128._M_dataplus._M_p._0_1_ = 0x2c;
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_128,1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        poVar11 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\'output\' : ",0xb);
        poVar11 = std::ostream::_M_insert<long>((long)poVar11);
        local_128._M_dataplus._M_p._0_1_ = 0x2c;
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_128,1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        poVar11 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\'non-unqiue\' : ",0xf);
        poVar11 = std::ostream::_M_insert<long>((long)poVar11);
        local_128._M_dataplus._M_p._0_1_ = 0x2c;
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_128,1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        poVar11 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\'duplicate\' : ",0xe);
        poVar11 = std::ostream::_M_insert<long>((long)poVar11);
        local_128._M_dataplus._M_p._0_1_ = 0x2c;
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_128,1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        poVar11 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\'updated_sequences\' : [",0x17)
        ;
        if (updated_sequences.
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&updated_sequences)
        {
          lVar13 = 0;
          p_Var14 = updated_sequences.
                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next;
          do {
            err._M_dataplus._M_p = (pointer)&err.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&err,p_Var14[1]._M_next,
                       (long)&(p_Var14[1]._M_prev)->_M_next + (long)p_Var14[1]._M_next);
            bVar15 = lVar13 != 0;
            lVar13 = lVar13 + -1;
            if (bVar15) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,", ",2);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'",1);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,err._M_dataplus._M_p,err._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\'",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)err._M_dataplus._M_p != &err.field_2) {
              operator_delete(err._M_dataplus._M_p,err.field_2._M_allocated_capacity + 1);
            }
            p_Var14 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&p_Var14->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
          } while (p_Var14 != (_List_node_base *)&updated_sequences);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"]",1);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
        std::ostream::put('@');
        poVar11 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"}",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
      }
      std::__cxx11::
      _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_clear(&updated_sequences.
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                );
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&sequences_to_add._M_t);
      argparse::args_t::~args_t(&args);
      return 0;
    }
  } while( true );
}

Assistant:

int main(int argc, const char *argv[]) {
    args_t args = args_t(argc, argv);
    
    
    long firstSequenceLength = 1L;
    
    try {
        char automatonState = 0;
        // 0 - between sequences
        // 1 - reading sequence name
        // 2 - reading sequence
        
        std::map<std::string, std::string> sequences_to_add;
        
        /*auto compare_records = [&] (const std::string & id1, const char* seq_value) -> int {
            std::map<std::string, std::string>::iterator it = sequences_to_add.find (id1);
            if (it !=  sequences_to_add.end()) {
                if (args.checks == id) {
                    return 1;
                }
                return it->second == std::string (seq_value) ? 2 : 3;
            }
            return 0;
        };*/
        


        initAlphabets(false, NULL, true);
        long non_unique_ids = 0;
        bool sequence_deduplication = false;
      
      if (args.checks == argparse::sequence) {
        if (args.op == argparse::remove) {
          sequence_deduplication = true;
        } else {
          throw (std::string ("sequence matching mode MUST also use the remove operation"));
        }
      }
      

        while (long state = readFASTA(args.input_add, automatonState, names, sequences, nameLengths,
                         seqLengths, firstSequenceLength, true)) { // read sequences one by one
            
            if (state == 2 || state == 3) {
                if (sequence_deduplication) {
                  // for this run mode, the map is inverted : sequence  -->  ID
                  sequences_to_add[sequences.getString()] = names.getString();
                } else {
                  long current_size = sequences_to_add.size();
                  std::string check_existing = sequences_to_add[names.getString()];
                  sequences_to_add[names.getString()] = sequences.getString();
                  if (current_size == sequences_to_add.size()) {
                      if (check_existing == sequences_to_add[names.getString()]) {
                          //cerr << std::string (names.getString()) + " is not a unique sequence ID in the master file" << endl;
                          non_unique_ids++;
                      } else {
                          throw (std::string (names.getString()) + " is not a unique sequence ID in the master file and different instances of this name have different sequences");
                      }
                  }
                }
                
                if (state == 3) {
                    break;
                }
            } else {
                throw (std::string ("Error reading FASTA file"));
            }
            //dump_fasta (sequences.getString(), firstSequenceLength, stdout);
        }
        
        long sequences_to_add_count = sequences_to_add.size(),
             duplicates = 0L,
             master_sequences = 0L,
             output = 0L;

        auto echo_fasta_sequence = [&] (const char* id, const char* data, FILE * where) -> void {
            output ++;
            fprintf (where, ">%s\n%s\n", id, data);
        };


        /*
         scan master records one by one;
         output those that are not present in sequences_to_add
         those that are present in sequences_to_add will be
        */
        
        std::list <std::string> updated_sequences;
        
        while (long state = readFASTA(args.input_master, automatonState, names, sequences, nameLengths, seqLengths, firstSequenceLength, true)) {
            if (state == 2 || state == 3) {
                std::string master_id (names.getString());
                //cerr << master_id << endl;
                master_sequences++;
              
                bool records_different,
                     ids_different;
                if (!sequence_deduplication) {
                  auto it = sequences_to_add.find (master_id);
                  ids_different = it == sequences_to_add.end();
                  
                  if (ids_different) {
                      records_different = true;
                  } else {
                      if (args.checks == argparse::id_and_sequence) {
                          records_different = it->second != std::string (sequences.getString());
                      } else {
                          records_different = false;
                      }
                  }
                } else {
                  ids_different = true;
                  auto it = sequences_to_add.find (sequences.getString());
                  records_different = it == sequences_to_add.end();
                }
                
                //cout << records_different << " " << ids_different << endl;
                
                if (!records_different) { // not unique
                    duplicates++;
                    if (args.op == argparse::replace) {
                        if (state == 3) {
                            break;
                        }
                        continue;
                    }
                    if (args.op == argparse::add) {
                        echo_fasta_sequence (master_id.c_str(), sequences.getString(), args.output);
                    }
                    sequences_to_add.erase (master_id);
                } else {
                    if (ids_different || args.op != argparse::replace) {
                        if (!ids_different) {
                            updated_sequences.push_back (master_id);
                            if (args.op == argparse::add) {
                                sequences_to_add.erase (master_id);
                            }
                        }
                        echo_fasta_sequence (master_id.c_str(), sequences.getString(), args.output);
                    }
                }
                
                if (state == 3) {
                    break;
                }
            } else {
                throw (std::string ("Error reading FASTA file"));
            }
        }
                
                // now output remaining sequences from the FASTA file
        
        if (args.op != argparse::remove) {
            for (std::pair<std::string, std::string> it : sequences_to_add) {
                echo_fasta_sequence (it.first.c_str(), it.second.c_str(), args.output);
            }
        }
        funlockfile (args.output);

        if (!args.quiet) {
            cerr << endl << "{" << endl << "'master' :" << master_sequences << ',' << endl <<
                      "'fasta'  : " << sequences_to_add_count << ',' << endl <<
                      "'output' : " << output << ',' << endl <<
                      "'non-unqiue' : " << non_unique_ids << ',' << endl <<
                      "'duplicate' : " << duplicates << ',' << endl <<
                      "'updated_sequences' : [";
            
            long k = 0;
            for (std::string s : updated_sequences) {
                if (k) {
                    cerr << ", ";
                }
                cerr << "'" << s << "'";
                k++;
            }
            cerr << "]" << endl << "}" << endl;
        }
        
        /*
        if (!args.quiet) {
            cerr << "Read " << sequences_to_add.size() << " sequences from the FASTA file" << endl;
        }*/

    } catch (const std::string err) {
        cerr << "ERROR: " << err << endl;
        return 1;
    }
    
    return 0;
}